

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * Catch::runTests(Totals *__return_storage_ptr__,Ptr<Catch::Config> *config)

{
  RunState *this;
  pointer pTVar1;
  size_t sVar2;
  pointer pFVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  TestSpecParser *this_00;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *pvVar6;
  pointer testCase;
  undefined1 local_330 [8];
  RunContext context;
  TestSpecParser local_100;
  string local_90;
  undefined1 local_70 [8];
  TestSpec testSpec;
  Ptr<Catch::IStreamingReporter> local_50;
  Ptr<Catch::IStreamingReporter> local_48;
  Ptr<Catch::IStreamingReporter> reporter;
  Ptr<const_Catch::IConfig> local_38;
  Ptr<const_Catch::IConfig> iconfig;
  
  local_38.m_p = (IConfig *)config->m_p;
  if ((Config *)local_38.m_p != (Config *)0x0) {
    (*(((Config *)local_38.m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  makeReporter((Catch *)&local_48,config);
  local_50.m_p = local_48.m_p;
  if (local_48.m_p != (IStreamingReporter *)0x0) {
    (*((local_48.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  addListeners((Catch *)local_330,&local_38,&local_50);
  Ptr<Catch::IStreamingReporter>::operator=(&local_48,(Ptr<Catch::IStreamingReporter> *)local_330);
  Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)local_330);
  Ptr<Catch::IStreamingReporter>::~Ptr(&local_50);
  RunContext::RunContext((RunContext *)local_330,&local_38,&local_48);
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->testCases).failedButOk = 0;
  (__return_storage_ptr__->assertions).failedButOk = 0;
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[6])(&local_100);
  RunContext::testGroupStarting((RunContext *)local_330,(string *)&local_100,1,1);
  std::__cxx11::string::~string((string *)&local_100);
  iVar5 = (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_70,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar5));
  if (local_70 ==
      (undefined1  [8])
      testSpec.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start) {
    TagAliasRegistry::get();
    local_100.m_arg._M_dataplus._M_p = (pointer)&local_100.m_arg.field_2;
    local_100.m_arg._M_string_length = 0;
    local_100.m_arg.field_2._M_local_buf[0] = '\0';
    local_100.m_currentFilter.m_patterns.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.m_currentFilter.m_patterns.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100.m_currentFilter.m_patterns.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100.m_testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.m_testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100.m_testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100.m_tagAliases = &TagAliasRegistry::get::instance.super_ITagAliasRegistry;
    std::__cxx11::string::string((string *)&local_90,"~[.]",(allocator *)((long)&reporter.m_p + 7));
    this_00 = TestSpecParser::parse(&local_100,&local_90);
    TestSpecParser::testSpec((TestSpec *)&context.m_trackerContext.m_runState,this_00);
    this = &context.m_trackerContext.m_runState;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::_M_move_assign
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_70
               ,this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)this);
    std::__cxx11::string::~string((string *)&local_90);
    TestSpecParser::~TestSpecParser(&local_100);
  }
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  pvVar6 = getAllTestCasesSorted(local_38.m_p);
  testCase = (pvVar6->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl
             .super__Vector_impl_data._M_start;
  pTVar1 = (pvVar6->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    sVar2 = context.m_totals.assertions.passed;
    if (testCase == pTVar1) {
      (*(((SharedImpl<Catch::IConfig> *)&(local_38.m_p)->super_IShared)->super_IConfig).
        super_IShared.super_NonCopyable._vptr_NonCopyable[6])(&local_100);
      pFVar3 = testSpec.m_filters.
               super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      RunContext::testGroupEnded
                ((RunContext *)local_330,(string *)&local_100,
                 (Totals *)
                 testSpec.m_filters.
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,1,1);
      std::__cxx11::string::~string((string *)&local_100);
      std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
                ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
                 local_70);
      RunContext::~RunContext((RunContext *)local_330);
      Ptr<Catch::IStreamingReporter>::~Ptr(&local_48);
      Ptr<const_Catch::IConfig>::~Ptr(&local_38);
      return (Totals *)pFVar3;
    }
    iVar5 = (**(code **)(*(long *)context.m_lastResult.m_resultData._64_8_ + 0x50))();
    if (sVar2 == (long)iVar5) {
LAB_00136139:
      (*((local_48.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
                (local_48.m_p,testCase);
    }
    else {
      bVar4 = matchTest(testCase,(TestSpec *)local_70,local_38.m_p);
      if (!bVar4) goto LAB_00136139;
      RunContext::runTest((Totals *)&local_100,(RunContext *)local_330,testCase);
      Totals::operator+=((Totals *)
                         testSpec.m_filters.
                         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(Totals *)&local_100);
    }
    testCase = testCase + 1;
  } while( true );
}

Assistant:

Totals runTests( Ptr<Config> const& config ) {

        Ptr<IConfig const> iconfig = config.get();

        Ptr<IStreamingReporter> reporter = makeReporter( config );
        reporter = addListeners( iconfig, reporter );

        RunContext context( iconfig, reporter );

        Totals totals;

        context.testGroupStarting( config->name(), 1, 1 );

        TestSpec testSpec = config->testSpec();
        if( !testSpec.hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

        std::vector<TestCase> const& allTestCases = getAllTestCasesSorted( *iconfig );
        for( std::vector<TestCase>::const_iterator it = allTestCases.begin(), itEnd = allTestCases.end();
                it != itEnd;
                ++it ) {
            if( !context.aborting() && matchTest( *it, testSpec, *iconfig ) )
                totals += context.runTest( *it );
            else
                reporter->skipTest( *it );
        }

        context.testGroupEnded( iconfig->name(), totals, 1, 1 );
        return totals;
    }